

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_add_clienthello_tlsext_inner
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_encoded,bool *out_needs_psk_binder)

{
  SSL *pSVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  uint16_t uVar5;
  int iVar6;
  cbb_st *pcVar7;
  pointer psVar8;
  byte *pbVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  uint8_t *puVar14;
  ulong local_200;
  size_t len_before;
  CBB child;
  CBB extension;
  uint16_t grease_ext_1;
  size_t bytes_written_compressed;
  size_t bytes_written;
  size_t len_compressed_before;
  size_t len_before_1;
  size_t i;
  size_t unpermuted;
  undefined1 local_108 [2];
  uint16_t grease_ext;
  CBB extensions_encoded;
  CBB extensions;
  undefined1 local_98 [8];
  ScopedCBB outer_extensions;
  ScopedCBB compressed;
  SSL *ssl;
  bool *out_needs_psk_binder_local;
  CBB *out_encoded_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  pSVar1 = hs->ssl;
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
             ((long)&outer_extensions.ctx_.u + 0x18));
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_98);
  iVar6 = CBB_add_u16_length_prefixed(out,(CBB *)((long)&extensions_encoded.u + 0x18));
  if ((iVar6 != 0) &&
     (iVar6 = CBB_add_u16_length_prefixed(out_encoded,(CBB *)local_108), iVar6 != 0)) {
    pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&outer_extensions.ctx_.u + 0x18));
    iVar6 = CBB_init(pcVar7,0x40);
    if (iVar6 != 0) {
      pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_98);
      iVar6 = CBB_init(pcVar7,0x40);
      if (iVar6 != 0) {
        hs->inner_extensions_sent = 0;
        psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&pSVar1->ctx);
        if ((*(ushort *)&psVar8->field_0x288 >> 5 & 1) != 0) {
          uVar5 = ssl_get_grease_value(hs,ssl_grease_extension1);
          pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&outer_extensions.ctx_.u + 0x18));
          bVar3 = add_padding_extension(pcVar7,uVar5,0);
          if (bVar3) {
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_98);
            iVar6 = CBB_add_u16(pcVar7,uVar5);
            if (iVar6 != 0) goto LAB_00168289;
          }
          hs_local._7_1_ = false;
          goto LAB_001689f4;
        }
LAB_00168289:
        for (i = 0; i < 0x1c; i = i + 1) {
          bVar3 = Array<unsigned_char>::empty(&hs->extension_permutation);
          if (bVar3) {
            local_200 = i;
          }
          else {
            pbVar9 = Array<unsigned_char>::operator[](&hs->extension_permutation,i);
            local_200 = (ulong)*pbVar9;
          }
          sVar10 = CBB_len((CBB *)((long)&extensions_encoded.u + 0x18));
          pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&outer_extensions.ctx_.u + 0x18));
          sVar11 = CBB_len(pcVar7);
          pcVar2 = *(code **)(kExtensions + local_200 * 0x28 + 8);
          pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&outer_extensions.ctx_.u + 0x18));
          bVar4 = (*pcVar2)(hs,(undefined1 *)((long)&extensions_encoded.u + 0x18),pcVar7,1);
          if ((bVar4 & 1) == 0) {
            ERR_put_error(0x10,0,0x93,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                          ,0xed2);
            ERR_add_error_dataf("extension %u",(ulong)*(ushort *)(kExtensions + local_200 * 0x28));
            hs_local._7_1_ = false;
            goto LAB_001689f4;
          }
          sVar12 = CBB_len((CBB *)((long)&extensions_encoded.u + 0x18));
          pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&outer_extensions.ctx_.u + 0x18));
          sVar13 = CBB_len(pcVar7);
          if (sVar12 != sVar10 && sVar13 != sVar11) {
            __assert_fail("bytes_written == 0 || bytes_written_compressed == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                          ,0xedb,
                          "bool bssl::ssl_add_clienthello_tlsext_inner(SSL_HANDSHAKE *, CBB *, CBB *, bool *)"
                         );
          }
          if ((sVar12 != sVar10) || (sVar13 != sVar11)) {
            hs->inner_extensions_sent = 1 << ((byte)local_200 & 0x1f) | hs->inner_extensions_sent;
          }
          if (sVar13 != sVar11) {
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_98);
            iVar6 = CBB_add_u16(pcVar7,*(uint16_t *)(kExtensions + local_200 * 0x28));
            if (iVar6 == 0) {
              hs_local._7_1_ = false;
              goto LAB_001689f4;
            }
          }
        }
        psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&pSVar1->ctx);
        if ((*(ushort *)&psVar8->field_0x288 >> 5 & 1) != 0) {
          uVar5 = ssl_get_grease_value(hs,ssl_grease_extension2);
          pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&outer_extensions.ctx_.u + 0x18));
          bVar3 = add_padding_extension(pcVar7,uVar5,1);
          if (bVar3) {
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_98);
            iVar6 = CBB_add_u16(pcVar7,uVar5);
            if (iVar6 != 0) goto LAB_00168680;
          }
          hs_local._7_1_ = false;
          goto LAB_001689f4;
        }
LAB_00168680:
        puVar14 = CBB_data((CBB *)((long)&extensions_encoded.u + 0x18));
        sVar10 = CBB_len((CBB *)((long)&extensions_encoded.u + 0x18));
        iVar6 = CBB_add_bytes((CBB *)local_108,puVar14,sVar10);
        if (iVar6 == 0) {
          hs_local._7_1_ = false;
          goto LAB_001689f4;
        }
        pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                            ((long)&outer_extensions.ctx_.u + 0x18));
        sVar10 = CBB_len(pcVar7);
        if (sVar10 == 0) {
LAB_001688d2:
          sVar10 = CBB_len((CBB *)((long)&extensions_encoded.u + 0x18));
          bVar3 = ext_pre_shared_key_add_clienthello
                            (hs,(CBB *)((long)&extensions_encoded.u + 0x18),out_needs_psk_binder,
                             ssl_client_hello_inner);
          if (bVar3) {
            puVar14 = CBB_data((CBB *)((long)&extensions_encoded.u + 0x18));
            sVar11 = CBB_len((CBB *)((long)&extensions_encoded.u + 0x18));
            iVar6 = CBB_add_bytes((CBB *)local_108,puVar14 + sVar10,sVar11 - sVar10);
            if (((iVar6 != 0) && (iVar6 = CBB_flush(out), iVar6 != 0)) &&
               (iVar6 = CBB_flush(out_encoded), iVar6 != 0)) {
              hs_local._7_1_ = true;
              goto LAB_001689f4;
            }
          }
          hs_local._7_1_ = false;
        }
        else {
          pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&outer_extensions.ctx_.u + 0x18));
          puVar14 = CBB_data(pcVar7);
          pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&outer_extensions.ctx_.u + 0x18));
          sVar10 = CBB_len(pcVar7);
          iVar6 = CBB_add_bytes((CBB *)((long)&extensions_encoded.u + 0x18),puVar14,sVar10);
          if ((((iVar6 != 0) && (iVar6 = CBB_add_u16((CBB *)local_108,0xfd00), iVar6 != 0)) &&
              (iVar6 = CBB_add_u16_length_prefixed((CBB *)local_108,(CBB *)((long)&child.u + 0x18)),
              iVar6 != 0)) &&
             (iVar6 = CBB_add_u8_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)&len_before),
             iVar6 != 0)) {
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_98);
            puVar14 = CBB_data(pcVar7);
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_98);
            sVar10 = CBB_len(pcVar7);
            iVar6 = CBB_add_bytes((CBB *)&len_before,puVar14,sVar10);
            if ((iVar6 != 0) && (iVar6 = CBB_flush((CBB *)local_108), iVar6 != 0))
            goto LAB_001688d2;
          }
          hs_local._7_1_ = false;
        }
        goto LAB_001689f4;
      }
    }
  }
  ERR_put_error(0x10,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0xeba);
  hs_local._7_1_ = false;
LAB_001689f4:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_98);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
             ((long)&outer_extensions.ctx_.u + 0x18));
  return hs_local._7_1_;
}

Assistant:

static bool ssl_add_clienthello_tlsext_inner(SSL_HANDSHAKE *hs, CBB *out,
                                             CBB *out_encoded,
                                             bool *out_needs_psk_binder) {
  // When writing ClientHelloInner, we construct the real and encoded
  // ClientHellos concurrently, to handle compression. Uncompressed extensions
  // are written to |extensions| and copied to |extensions_encoded|. Compressed
  // extensions are buffered in |compressed| and written to the end. (ECH can
  // only compress continguous extensions.)
  SSL *const ssl = hs->ssl;
  bssl::ScopedCBB compressed, outer_extensions;
  CBB extensions, extensions_encoded;
  if (!CBB_add_u16_length_prefixed(out, &extensions) ||
      !CBB_add_u16_length_prefixed(out_encoded, &extensions_encoded) ||
      !CBB_init(compressed.get(), 64) ||
      !CBB_init(outer_extensions.get(), 64)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  hs->inner_extensions_sent = 0;

  if (ssl->ctx->grease_enabled) {
    // Add a fake empty extension. See RFC 8701. This always matches
    // |ssl_add_clienthello_tlsext|, so compress it.
    uint16_t grease_ext = ssl_get_grease_value(hs, ssl_grease_extension1);
    if (!add_padding_extension(compressed.get(), grease_ext, 0) ||
        !CBB_add_u16(outer_extensions.get(), grease_ext)) {
      return false;
    }
  }

  for (size_t unpermuted = 0; unpermuted < kNumExtensions; unpermuted++) {
    size_t i = hs->extension_permutation.empty()
                   ? unpermuted
                   : hs->extension_permutation[unpermuted];
    const size_t len_before = CBB_len(&extensions);
    const size_t len_compressed_before = CBB_len(compressed.get());
    if (!kExtensions[i].add_clienthello(hs, &extensions, compressed.get(),
                                        ssl_client_hello_inner)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_ERROR_ADDING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)kExtensions[i].value);
      return false;
    }

    const size_t bytes_written = CBB_len(&extensions) - len_before;
    const size_t bytes_written_compressed =
        CBB_len(compressed.get()) - len_compressed_before;
    // The callback may write to at most one output.
    assert(bytes_written == 0 || bytes_written_compressed == 0);
    if (bytes_written != 0 || bytes_written_compressed != 0) {
      hs->inner_extensions_sent |= (1u << i);
    }
    // If compressed, update the running ech_outer_extensions extension.
    if (bytes_written_compressed != 0 &&
        !CBB_add_u16(outer_extensions.get(), kExtensions[i].value)) {
      return false;
    }
  }

  if (ssl->ctx->grease_enabled) {
    // Add a fake non-empty extension. See RFC 8701. This always matches
    // |ssl_add_clienthello_tlsext|, so compress it.
    uint16_t grease_ext = ssl_get_grease_value(hs, ssl_grease_extension2);
    if (!add_padding_extension(compressed.get(), grease_ext, 1) ||
        !CBB_add_u16(outer_extensions.get(), grease_ext)) {
      return false;
    }
  }

  // Uncompressed extensions are encoded as-is.
  if (!CBB_add_bytes(&extensions_encoded, CBB_data(&extensions),
                     CBB_len(&extensions))) {
    return false;
  }

  // Flush all the compressed extensions.
  if (CBB_len(compressed.get()) != 0) {
    CBB extension, child;
    // Copy them as-is in the real ClientHelloInner.
    if (!CBB_add_bytes(&extensions, CBB_data(compressed.get()),
                       CBB_len(compressed.get())) ||
        // Replace with ech_outer_extensions in the encoded form.
        !CBB_add_u16(&extensions_encoded, TLSEXT_TYPE_ech_outer_extensions) ||
        !CBB_add_u16_length_prefixed(&extensions_encoded, &extension) ||
        !CBB_add_u8_length_prefixed(&extension, &child) ||
        !CBB_add_bytes(&child, CBB_data(outer_extensions.get()),
                       CBB_len(outer_extensions.get())) ||
        !CBB_flush(&extensions_encoded)) {
      return false;
    }
  }

  // The PSK extension must be last. It is never compressed. Note, if there is a
  // binder, the caller will need to update both ClientHelloInner and
  // EncodedClientHelloInner after computing it.
  const size_t len_before = CBB_len(&extensions);
  if (!ext_pre_shared_key_add_clienthello(hs, &extensions, out_needs_psk_binder,
                                          ssl_client_hello_inner) ||
      !CBB_add_bytes(&extensions_encoded, CBB_data(&extensions) + len_before,
                     CBB_len(&extensions) - len_before) ||
      !CBB_flush(out) ||  //
      !CBB_flush(out_encoded)) {
    return false;
  }

  return true;
}